

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::(anonymous_namespace)::TestCase4992::run()::$_0::operator()(kj::HttpServer::SuspendableRequest&)
::Response__(void *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
            AsyncInputStream *requestBody,Response *response)

{
  undefined4 in_register_00000034;
  Type local_58;
  AsyncInputStream *local_38;
  HttpHeaders *headers_local;
  long lStack_28;
  HttpMethod method_local;
  ServiceImpl *this_local;
  StringPtr url_local;
  
  lStack_28 = CONCAT44(in_register_00000034,method);
  this_local = (ServiceImpl *)url.content.size_;
  headers_local._4_4_ = url.content.ptr._0_4_;
  local_58.serviceCount = *(uint **)(lStack_28 + 0x40);
  local_58.table = (HttpHeaderTable *)(lStack_28 + 8);
  local_58.requestBody = (AsyncInputStream *)response;
  local_38 = requestBody;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  kj::operator()((kj *)this,&local_58);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
          HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
          kj::AsyncInputStream& requestBody, Response& response) override {
        return evalLater([&serviceCount = serviceCount, &table = table, &requestBody, &response]() {
          // This KJ_EXPECT here is the entire point of this test.
          KJ_EXPECT(serviceCount == 1)
          HttpHeaders responseHeaders(table);
          response.send(200, "OK", responseHeaders);
          return requestBody.readAllBytes().ignoreResult();
        });
      }